

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::SerializeWithCachedSizes
          (BayesianProbitRegressor_FeatureValueWeight *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BayesianProbitRegressor_FeatureValueWeight *this_local;
  
  uVar2 = featurevalue(this);
  if (uVar2 != 0) {
    uVar2 = featurevalue(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,uVar2,output);
  }
  bVar1 = has_featureweight(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->featureweight_->super_MessageLite,output);
  }
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 featureValue = 1;
  if (this->featurevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->featurevalue(), output);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian featureWeight = 2;
  if (this->has_featureweight()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->featureweight_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
}